

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractWrittenFont.cpp
# Opt level: O1

void __thiscall
AbstractWrittenFont::AppendGlyphs
          (AbstractWrittenFont *this,GlyphUnicodeMappingListList *inGlyphsList,
          UShortListList *outEncodedCharacters,bool *outEncodingIsMultiByte,
          ObjectIDType *outFontObjectID)

{
  WrittenFontRepresentation **ppWVar1;
  _Rb_tree_header *p_Var2;
  bool bVar3;
  int iVar4;
  WrittenFontRepresentation *pWVar5;
  IndirectObjectsReferenceRegistry *this_00;
  ObjectIDType OVar6;
  WrittenFontRepresentation **ppWVar7;
  AbstractWrittenFont *this_01;
  
  ppWVar7 = &this->mCIDRepresentation;
  this_01 = this;
  if (this->mCIDRepresentation == (WrittenFontRepresentation *)0x0) {
LAB_001fbd5d:
    ppWVar1 = &this->mANSIRepresentation;
    if (this->mANSIRepresentation != (WrittenFontRepresentation *)0x0) {
      bVar3 = CanEncodeWithIncludedChars
                        (this_01,this->mANSIRepresentation,inGlyphsList,outEncodedCharacters);
      if (!bVar3) goto LAB_001fbd79;
LAB_001fbdf1:
      bVar3 = false;
      ppWVar7 = ppWVar1;
      goto LAB_001fbe38;
    }
LAB_001fbd79:
    if (*ppWVar7 == (WrittenFontRepresentation *)0x0) {
      if (*ppWVar1 == (WrittenFontRepresentation *)0x0) {
        pWVar5 = (WrittenFontRepresentation *)operator_new(0x38);
        p_Var2 = &(pWVar5->mGlyphIDToEncodedChar)._M_t._M_impl.super__Rb_tree_header;
        (pWVar5->mGlyphIDToEncodedChar)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
             _S_red;
        (pWVar5->mGlyphIDToEncodedChar)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        (pWVar5->mGlyphIDToEncodedChar)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &p_Var2->_M_header;
        (pWVar5->mGlyphIDToEncodedChar)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             &p_Var2->_M_header;
        (pWVar5->mGlyphIDToEncodedChar)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        pWVar5->mWrittenObjectID = 0;
        *ppWVar1 = pWVar5;
      }
      iVar4 = (*(this->super_IWrittenFont)._vptr_IWrittenFont[8])
                        (this,inGlyphsList,outEncodedCharacters);
      if ((char)iVar4 != '\0') {
        if ((*ppWVar1)->mWrittenObjectID == 0) {
          this_00 = ObjectsContext::GetInDirectObjectsRegistry(this->mObjectsContext);
          OVar6 = IndirectObjectsReferenceRegistry::AllocateNewObjectID(this_00);
          this->mANSIRepresentation->mWrittenObjectID = OVar6;
        }
        goto LAB_001fbdf1;
      }
      pWVar5 = (WrittenFontRepresentation *)operator_new(0x38);
      p_Var2 = &(pWVar5->mGlyphIDToEncodedChar)._M_t._M_impl.super__Rb_tree_header;
      (pWVar5->mGlyphIDToEncodedChar)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red
      ;
      (pWVar5->mGlyphIDToEncodedChar)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      (pWVar5->mGlyphIDToEncodedChar)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &p_Var2->_M_header;
      (pWVar5->mGlyphIDToEncodedChar)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           &p_Var2->_M_header;
      (pWVar5->mGlyphIDToEncodedChar)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      pWVar5->mWrittenObjectID = 0;
      this->mCIDRepresentation = pWVar5;
    }
    AddToCIDRepresentation(this,inGlyphsList,outEncodedCharacters);
  }
  else {
    bVar3 = CanEncodeWithIncludedChars
                      (this,this->mCIDRepresentation,inGlyphsList,outEncodedCharacters);
    if (!bVar3) goto LAB_001fbd5d;
  }
  bVar3 = true;
LAB_001fbe38:
  *outFontObjectID = (*ppWVar7)->mWrittenObjectID;
  *outEncodingIsMultiByte = bVar3;
  return;
}

Assistant:

void AbstractWrittenFont::AppendGlyphs(	const GlyphUnicodeMappingListList& inGlyphsList,
										UShortListList& outEncodedCharacters,
										bool& outEncodingIsMultiByte,
										ObjectIDType &outFontObjectID)
{
	// same as the regular one, but with lists of strings

	if(mCIDRepresentation && CanEncodeWithIncludedChars(mCIDRepresentation,inGlyphsList,outEncodedCharacters))
	{
		outFontObjectID = mCIDRepresentation->mWrittenObjectID;
		outEncodingIsMultiByte = true;
		return;
	}

	if(mANSIRepresentation && CanEncodeWithIncludedChars(mANSIRepresentation,inGlyphsList,outEncodedCharacters))
	{
		outFontObjectID = mANSIRepresentation->mWrittenObjectID;
		outEncodingIsMultiByte = false;
		return;
	}

	if(mCIDRepresentation)
	{
		AddToCIDRepresentation(inGlyphsList,outEncodedCharacters);
		outFontObjectID = mCIDRepresentation->mWrittenObjectID;
		outEncodingIsMultiByte = true;
		return;
	}

	if(!mANSIRepresentation)
		mANSIRepresentation = new WrittenFontRepresentation();

	if(AddToANSIRepresentation(inGlyphsList,outEncodedCharacters))
	{
		if(0 == mANSIRepresentation->mWrittenObjectID)
			mANSIRepresentation->mWrittenObjectID = mObjectsContext->GetInDirectObjectsRegistry().AllocateNewObjectID();

		outFontObjectID = mANSIRepresentation->mWrittenObjectID;
		outEncodingIsMultiByte = false;
		return;			
	}

	mCIDRepresentation = new WrittenFontRepresentation();
	AddToCIDRepresentation(inGlyphsList,outEncodedCharacters);
	outFontObjectID = mCIDRepresentation->mWrittenObjectID;
	outEncodingIsMultiByte = true;
}